

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  
  if (nbits != 0) {
    if (nbits == 1) {
      if ((writer->bp & 7) == 0) {
        uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
        if (uVar2 == 0) {
          return;
        }
        writer->data->data[writer->data->size - 1] = '\0';
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | (byte)(value << (writer->bp & 7));
      writer->bp = writer->bp + '\x01';
    }
    else {
      sVar3 = 0;
      do {
        if ((writer->bp & 7) == 0) {
          uVar2 = ucvector_resize(writer->data,writer->data->size + 1);
          if (uVar2 == 0) {
            return;
          }
          writer->data->data[writer->data->size - 1] = '\0';
        }
        pbVar1 = writer->data->data + (writer->data->size - 1);
        *pbVar1 = *pbVar1 | ((value >> ((uint)sVar3 & 0x1f) & 1) != 0) << (writer->bp & 7);
        writer->bp = writer->bp + '\x01';
        sVar3 = sVar3 + 1;
      } while (nbits != sVar3);
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}